

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O3

bool __thiscall MyGame::Example::Stat::Verify(Stat *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  String *str;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,4), bVar1))
  {
    if ((*(ushort *)(this + -(long)*(int *)this) < 5) ||
       (uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 == 0)) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + *(uint *)(this + uVar2) + uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if (((bVar1) &&
        (bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,6,8), bVar1)) &&
       (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,8,2),
       bVar1)) {
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset(verifier, VT_ID) &&
           verifier.VerifyString(id()) &&
           VerifyField<int64_t>(verifier, VT_VAL, 8) &&
           VerifyField<uint16_t>(verifier, VT_COUNT, 2) &&
           verifier.EndTable();
  }